

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O3

void telnet_negotiate(telnet_t *telnet,uchar cmd,uchar telopt)

{
  uint uVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  telnet_rfc1143_t *ptVar5;
  int *piVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  char us;
  uchar uVar10;
  int iVar11;
  int in_R8D;
  byte bVar12;
  byte bVar13;
  uchar bytes [3];
  char local_43 [3];
  telnet_event_t local_40;
  
  bVar13 = telnet->flags;
  if ((bVar13 & 1) != 0) {
    local_43[1] = cmd;
    local_43[0] = 0xff;
    goto LAB_0010294e;
  }
  uVar1 = telnet->q_cnt;
  uVar9 = (ulong)uVar1;
  if (uVar9 != 0) {
    uVar8 = 0;
    do {
      if (telnet->q[uVar8].telopt == telopt) {
        uVar3 = (ushort)telnet->q[uVar8].state << 8;
        goto LAB_00102983;
      }
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
  uVar3 = 0;
LAB_00102983:
  if (3 < cmd - 0xfb) {
    return;
  }
  uVar4 = uVar3 >> 8;
  bVar12 = (byte)(uVar3 >> 8);
  switch((uint)cmd) {
  case 0xfb:
    if ((uVar4 & 0xf) == 5) {
      us = '\x03';
    }
    else {
      if ((uVar4 & 0xf) != 2) {
        if ((uVar4 & 0xf) != 0) {
          return;
        }
        _set_rfc1143(telnet,telopt,'\x03',bVar12 >> 4);
        local_43[0] = -1;
        local_43[1] = -5;
        goto LAB_0010294e;
      }
      us = '\x04';
    }
    break;
  case 0xfc:
    uVar4 = uVar4 & 0xf;
    if (uVar4 == 4) {
      us = '\x02';
    }
    else {
      if (uVar4 != 3) {
        if (uVar4 != 1) {
          return;
        }
        _set_rfc1143(telnet,telopt,'\x02',bVar12 >> 4);
        local_43[0] = -1;
        local_43[1] = -4;
        goto LAB_0010294e;
      }
      us = '\x05';
    }
    break;
  case 0xfd:
    uVar3 = uVar3 >> 0xc;
    if (uVar3 == 5) {
      ptVar5 = telnet->q;
      if (uVar1 != 0) {
        uVar8 = 0;
        do {
          if (ptVar5[uVar8].telopt == telopt) {
            uVar10 = (bVar12 & 0xf) + 0x30;
            goto LAB_00102db8;
          }
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      if (telnet->q_size <= uVar1) {
        ptVar5 = (telnet_rfc1143_t *)realloc(ptVar5,(ulong)(telnet->q_size + 4) * 2);
        if (ptVar5 == (telnet_rfc1143_t *)0x0) {
LAB_00102d3d:
          piVar6 = __errno_location();
          pcVar7 = strerror(*piVar6);
          _error(telnet,0x151,"_set_rfc1143",TELNET_ENOMEM,in_R8D,"realloc() failed: %s",pcVar7);
          return;
        }
        uVar1 = telnet->q_size;
        *(undefined8 *)(ptVar5 + uVar1) = 0;
        telnet->q = ptVar5;
        telnet->q_size = uVar1 + 4;
        uVar9 = (ulong)telnet->q_cnt;
      }
      iVar11 = (int)uVar9;
      ptVar5[uVar9].telopt = telopt;
      bVar13 = bVar12 & 0xf | 0x30;
LAB_00102d01:
      ptVar5[uVar9].state = bVar13;
      telnet->q_cnt = iVar11 + 1;
      return;
    }
    if (uVar3 == 2) {
      ptVar5 = telnet->q;
      if (uVar1 != 0) {
        uVar8 = 0;
        do {
          if (ptVar5[uVar8].telopt == telopt) {
            uVar10 = (bVar12 & 0xf) + 0x40;
LAB_00102db8:
            ptVar5[uVar8].state = uVar10;
            if (telopt != '\0') {
              return;
            }
            bVar2 = (bVar13 & 0x9e) + 0x20;
            if ((bVar12 & 0xf) != 1) {
              bVar2 = bVar13 & 0x9e;
            }
            telnet->flags = bVar2;
            return;
          }
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      if (telnet->q_size <= uVar1) {
        ptVar5 = (telnet_rfc1143_t *)realloc(ptVar5,(ulong)(telnet->q_size + 4) * 2);
        if (ptVar5 == (telnet_rfc1143_t *)0x0) goto LAB_00102d3d;
        uVar1 = telnet->q_size;
        *(undefined8 *)(ptVar5 + uVar1) = 0;
        telnet->q = ptVar5;
        telnet->q_size = uVar1 + 4;
        uVar9 = (ulong)telnet->q_cnt;
      }
      iVar11 = (int)uVar9;
      ptVar5[uVar9].telopt = telopt;
      bVar13 = bVar12 & 0xf | 0x40;
      goto LAB_00102d01;
    }
    if (uVar3 != 0) {
      return;
    }
    bVar12 = bVar12 & 0xf;
    ptVar5 = telnet->q;
    if (uVar1 != 0) {
      uVar8 = 0;
      do {
        if (ptVar5[uVar8].telopt == telopt) {
          ptVar5[uVar8].state = bVar12 + 0x30;
          if (telopt == '\0') {
            bVar2 = (bVar13 & 0x9e) + 0x20;
            if (bVar12 != 1) {
              bVar2 = bVar13 & 0x9e;
            }
            telnet->flags = bVar2;
          }
          goto LAB_00102e3f;
        }
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    if (uVar1 < telnet->q_size) {
LAB_00102a61:
      ptVar5[uVar9].telopt = telopt;
      ptVar5[uVar9].state = bVar12 | 0x30;
      telnet->q_cnt = (int)uVar9 + 1;
    }
    else {
      ptVar5 = (telnet_rfc1143_t *)realloc(ptVar5,(ulong)(telnet->q_size + 4) * 2);
      if (ptVar5 != (telnet_rfc1143_t *)0x0) {
        uVar1 = telnet->q_size;
        *(undefined8 *)(ptVar5 + uVar1) = 0;
        telnet->q = ptVar5;
        telnet->q_size = uVar1 + 4;
        uVar9 = (ulong)telnet->q_cnt;
        goto LAB_00102a61;
      }
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      _error(telnet,0x151,"_set_rfc1143",TELNET_ENOMEM,in_R8D,"realloc() failed: %s",pcVar7);
    }
LAB_00102e3f:
    local_43[0] = -1;
    local_43[1] = -3;
LAB_0010294e:
    local_40.data.buffer = local_43;
    local_40.type = TELNET_EV_SEND;
    local_40.data.size = 3;
    local_43[2] = telopt;
    (*telnet->eh)(telnet,&local_40,telnet->ud);
    return;
  case 0xfe:
    uVar3 = uVar3 >> 0xc;
    if (uVar3 == 4) {
      ptVar5 = telnet->q;
      if (uVar1 != 0) {
        uVar8 = 0;
        do {
          if (ptVar5[uVar8].telopt == telopt) {
            uVar10 = (bVar12 & 0xf) + 0x20;
            goto LAB_00102db8;
          }
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      if (telnet->q_size <= uVar1) {
        ptVar5 = (telnet_rfc1143_t *)realloc(ptVar5,(ulong)(telnet->q_size + 4) * 2);
        if (ptVar5 == (telnet_rfc1143_t *)0x0) goto LAB_00102d3d;
        uVar1 = telnet->q_size;
        *(undefined8 *)(ptVar5 + uVar1) = 0;
        telnet->q = ptVar5;
        telnet->q_size = uVar1 + 4;
        uVar9 = (ulong)telnet->q_cnt;
      }
      iVar11 = (int)uVar9;
      ptVar5[uVar9].telopt = telopt;
      bVar13 = bVar12 & 0xf | 0x20;
      goto LAB_00102d01;
    }
    if (uVar3 == 3) {
      ptVar5 = telnet->q;
      if (uVar1 != 0) {
        uVar8 = 0;
        do {
          if (ptVar5[uVar8].telopt == telopt) {
            uVar10 = (bVar12 & 0xf) + 0x50;
            goto LAB_00102db8;
          }
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      if (telnet->q_size <= uVar1) {
        ptVar5 = (telnet_rfc1143_t *)realloc(ptVar5,(ulong)(telnet->q_size + 4) * 2);
        if (ptVar5 == (telnet_rfc1143_t *)0x0) goto LAB_00102d3d;
        uVar1 = telnet->q_size;
        *(undefined8 *)(ptVar5 + uVar1) = 0;
        telnet->q = ptVar5;
        telnet->q_size = uVar1 + 4;
        uVar9 = (ulong)telnet->q_cnt;
      }
      iVar11 = (int)uVar9;
      ptVar5[uVar9].telopt = telopt;
      bVar13 = bVar12 & 0xf | 0x50;
      goto LAB_00102d01;
    }
    if (uVar3 != 1) {
      return;
    }
    bVar12 = bVar12 & 0xf;
    ptVar5 = telnet->q;
    if (uVar1 != 0) {
      uVar8 = 0;
      do {
        if (ptVar5[uVar8].telopt == telopt) {
          ptVar5[uVar8].state = bVar12 + 0x20;
          if (telopt == '\0') {
            bVar2 = (bVar13 & 0x9e) + 0x20;
            if (bVar12 != 1) {
              bVar2 = bVar13 & 0x9e;
            }
            telnet->flags = bVar2;
          }
          goto LAB_00102e80;
        }
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    if (uVar1 < telnet->q_size) {
LAB_00102aef:
      ptVar5[uVar9].telopt = telopt;
      ptVar5[uVar9].state = bVar12 | 0x20;
      telnet->q_cnt = (int)uVar9 + 1;
    }
    else {
      ptVar5 = (telnet_rfc1143_t *)realloc(ptVar5,(ulong)(telnet->q_size + 4) * 2);
      if (ptVar5 != (telnet_rfc1143_t *)0x0) {
        uVar1 = telnet->q_size;
        *(undefined8 *)(ptVar5 + uVar1) = 0;
        telnet->q = ptVar5;
        telnet->q_size = uVar1 + 4;
        uVar9 = (ulong)telnet->q_cnt;
        goto LAB_00102aef;
      }
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      _error(telnet,0x151,"_set_rfc1143",TELNET_ENOMEM,in_R8D,"realloc() failed: %s",pcVar7);
    }
LAB_00102e80:
    local_43[0] = -1;
    local_43[1] = -2;
    goto LAB_0010294e;
  }
  _set_rfc1143(telnet,telopt,us,bVar12 >> 4);
  return;
}

Assistant:

void telnet_negotiate(telnet_t *telnet, unsigned char cmd,
		unsigned char telopt) {
	telnet_rfc1143_t q;

	/* if we're in proxy mode, just send it now */
	if (telnet->flags & TELNET_FLAG_PROXY) {
		unsigned char bytes[3];
		bytes[0] = TELNET_IAC;
		bytes[1] = cmd;
		bytes[2] = telopt;
		_sendu(telnet, bytes, 3);
		return;
	}

	/* get current option states */
	q = _get_rfc1143(telnet, telopt);

	switch (cmd) {
	/* advertise willingess to support an option */
	case TELNET_WILL:
		switch (Q_US(q)) {
		case Q_NO:
			_set_rfc1143(telnet, telopt, Q_WANTYES, Q_HIM(q));
			_send_negotiate(telnet, TELNET_WILL, telopt);
			break;
		case Q_WANTNO:
			_set_rfc1143(telnet, telopt, Q_WANTNO_OP, Q_HIM(q));
			break;
		case Q_WANTYES_OP:
			_set_rfc1143(telnet, telopt, Q_WANTYES, Q_HIM(q));
			break;
		}
		break;

	/* force turn-off of locally enabled option */
	case TELNET_WONT:
		switch (Q_US(q)) {
		case Q_YES:
			_set_rfc1143(telnet, telopt, Q_WANTNO, Q_HIM(q));
			_send_negotiate(telnet, TELNET_WONT, telopt);
			break;
		case Q_WANTYES:
			_set_rfc1143(telnet, telopt, Q_WANTYES_OP, Q_HIM(q));
			break;
		case Q_WANTNO_OP:
			_set_rfc1143(telnet, telopt, Q_WANTNO, Q_HIM(q));
			break;
		}
		break;

	/* ask remote end to enable an option */
	case TELNET_DO:
		switch (Q_HIM(q)) {
		case Q_NO:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES);
			_send_negotiate(telnet, TELNET_DO, telopt);
			break;
		case Q_WANTNO:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO_OP);
			break;
		case Q_WANTYES_OP:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES);
			break;
		}
		break;

	/* demand remote end disable an option */
	case TELNET_DONT:
		switch (Q_HIM(q)) {
		case Q_YES:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO);
			_send_negotiate(telnet, TELNET_DONT, telopt);
			break;
		case Q_WANTYES:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES_OP);
			break;
		case Q_WANTNO_OP:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO);
			break;
		}
		break;
	}
}